

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_strfmt(char *buf,int buf_size,char *fmt,__va_list_tag *args)

{
  int result;
  __va_list_tag *args_local;
  char *fmt_local;
  int buf_size_local;
  char *buf_local;
  
  if (buf == (char *)0x0) {
    __assert_fail("buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x1be0,"int nk_strfmt(char *, int, const char *, struct __va_list_tag *)");
  }
  if (buf_size != 0) {
    if (((buf == (char *)0x0) || (buf_size == 0)) || (fmt == (char *)0x0)) {
      buf_local._4_4_ = 0;
    }
    else {
      buf_local._4_4_ = nk_vsnprintf(buf,buf_size,fmt,args);
    }
    return buf_local._4_4_;
  }
  __assert_fail("buf_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x1be1,"int nk_strfmt(char *, int, const char *, struct __va_list_tag *)");
}

Assistant:

NK_LIB int
nk_strfmt(char *buf, int buf_size, const char *fmt, va_list args)
{
    int result = -1;
    NK_ASSERT(buf);
    NK_ASSERT(buf_size);
    if (!buf || !buf_size || !fmt) return 0;
#ifdef NK_INCLUDE_STANDARD_IO
    result = NK_VSNPRINTF(buf, (nk_size)buf_size, fmt, args);
    result = (result >= buf_size) ? -1: result;
    buf[buf_size-1] = 0;
#else
    result = nk_vsnprintf(buf, buf_size, fmt, args);
#endif
    return result;
}